

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

void __thiscall
presolve::HPresolve::transformColumn
          (HPresolve *this,HighsPostsolveStack *postsolve_stack,HighsInt col,double scale,
          double constant)

{
  HPresolve *pHVar1;
  bool bVar2;
  uint uVar3;
  reference this_00;
  char *pcVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  reference __b;
  reference pvVar8;
  int in_EDX;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  iterator *piVar9;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar10;
  HPresolve *pHVar11;
  HPresolve *in_XMM1_Qa;
  double rowConstant;
  HighsInt row;
  double val;
  HighsInt coliter;
  double boundScale;
  HighsSliceNonzero *nonzero_1;
  iterator __end2_1;
  iterator __begin2_1;
  HighsTripletListSlice *__range2_1;
  double oldImplUpper;
  double oldImplLower;
  HighsSliceNonzero *nonzero;
  iterator __end2;
  iterator __begin2;
  HighsTripletListSlice *__range2;
  double oldUpper;
  double oldLower;
  HighsInt in_stack_fffffffffffffdcc;
  HPresolve *in_stack_fffffffffffffdd0;
  double in_stack_fffffffffffffde8;
  double dVar12;
  double in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  HighsInt HVar13;
  HPresolve *in_stack_fffffffffffffe00;
  double in_stack_fffffffffffffe08;
  double in_stack_fffffffffffffe10;
  double in_stack_fffffffffffffe18;
  HighsLinearSumBounds *in_stack_fffffffffffffe20;
  double in_stack_fffffffffffffe28;
  long *plVar14;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  int iVar15;
  undefined8 in_stack_fffffffffffffe38;
  HighsLinearSumBounds *in_stack_fffffffffffffe40;
  value_type in_stack_fffffffffffffe60;
  HPresolve *in_stack_fffffffffffffe68;
  HPresolve *in_stack_fffffffffffffe70;
  int local_134;
  iterator local_120;
  iterator local_100;
  undefined1 local_e0 [32];
  undefined1 *local_c0;
  value_type local_b8;
  value_type local_b0;
  HighsSliceNonzero *local_a8;
  iterator local_a0;
  iterator local_80;
  undefined1 local_60 [32];
  undefined1 *local_40;
  value_type local_38;
  value_type local_30;
  HPresolve *local_28;
  double local_20;
  int local_14;
  
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_14 = in_EDX;
  if (in_RDI[3] != 0) {
    std::unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>::operator->
              ((unique_ptr<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_> *)0x6fd0bf)
    ;
    HighsImplications::columnTransformed
              ((HighsImplications *)in_stack_fffffffffffffe20,
               (HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20),in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08);
  }
  HighsPostsolveStack::linearTransform
            ((HighsPostsolveStack *)in_stack_fffffffffffffe00,
             (HighsInt)((ulong)in_stack_fffffffffffffdf8 >> 0x20),in_stack_fffffffffffffdf0,
             in_stack_fffffffffffffde8);
  if (((double)local_28 != 0.0) || (NAN((double)local_28))) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
    local_30 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
    pHVar11 = local_28;
    local_38 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
    pHVar1 = local_28;
    *pvVar5 = *pvVar5 - (double)pHVar11;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
    *pvVar5 = *pvVar5 - (double)pHVar1;
    getColumnVector(in_stack_fffffffffffffe00,(HighsInt)((ulong)in_stack_fffffffffffffdf8 >> 0x20));
    local_40 = local_60;
    HighsMatrixSlice<HighsTripletListSlice>::begin
              ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffdd0);
    HighsMatrixSlice<HighsTripletListSlice>::end
              ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffdd0);
    while( true ) {
      piVar9 = &local_a0;
      bVar2 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_80,piVar9);
      HVar13 = (HighsInt)((ulong)in_stack_fffffffffffffdf8 >> 0x20);
      if (!bVar2) break;
      local_a8 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_80);
      pcVar4 = HighsSliceNonzero::index(local_a8,(char *)piVar9,__c);
      HighsSliceNonzero::value(local_a8);
      pcVar4 = (char *)((ulong)pcVar4 & 0xffffffff);
      HighsLinearSumBounds::updatedVarLower
                (in_stack_fffffffffffffe40,(HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (HighsInt)in_stack_fffffffffffffe38,
                 (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28);
      HighsSliceNonzero::index(local_a8,pcVar4,__c_00);
      HighsSliceNonzero::value(local_a8);
      HighsLinearSumBounds::updatedVarUpper
                (in_stack_fffffffffffffe40,(HighsInt)((ulong)in_stack_fffffffffffffe38 >> 0x20),
                 (HighsInt)in_stack_fffffffffffffe38,
                 (double)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 in_stack_fffffffffffffe28);
      HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_80);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)local_14);
    local_b0 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)local_14);
    local_b8 = *pvVar5;
    in_stack_fffffffffffffe68 = local_28;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)local_14);
    *pvVar5 = *pvVar5 - (double)in_stack_fffffffffffffe68;
    in_stack_fffffffffffffe70 = local_28;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)local_14);
    *pvVar5 = *pvVar5 - (double)in_stack_fffffffffffffe70;
    getColumnVector(in_stack_fffffffffffffe00,HVar13);
    local_c0 = local_e0;
    HighsMatrixSlice<HighsTripletListSlice>::begin
              ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffdd0);
    HighsMatrixSlice<HighsTripletListSlice>::end
              ((HighsMatrixSlice<HighsTripletListSlice> *)in_stack_fffffffffffffdd0);
    while( true ) {
      piVar9 = &local_120;
      bVar2 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator!=(&local_100,piVar9);
      if (!bVar2) break;
      this_00 = HighsMatrixSlice<HighsTripletListSlice>::iterator::operator*(&local_100);
      plVar14 = in_RDI + 0x56;
      pcVar4 = HighsSliceNonzero::index(this_00,(char *)piVar9,__c_01);
      uVar3 = (uint)pcVar4;
      iVar15 = local_14;
      HighsSliceNonzero::value(this_00);
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
      pcVar4 = (char *)(ulong)uVar3;
      HighsLinearSumBounds::updatedImplVarLower
                ((HighsLinearSumBounds *)CONCAT44(iVar15,uVar3),(HighsInt)((ulong)plVar14 >> 0x20),
                 (HighsInt)plVar14,(double)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (HighsInt)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      HighsSliceNonzero::index(this_00,pcVar4,__c_02);
      HighsSliceNonzero::value(this_00);
      in_stack_fffffffffffffe60 = local_b8;
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_14);
      HighsLinearSumBounds::updatedImplVarUpper
                ((HighsLinearSumBounds *)CONCAT44(iVar15,uVar3),(HighsInt)((ulong)plVar14 >> 0x20),
                 (HighsInt)plVar14,(double)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                 (HighsInt)((ulong)in_stack_fffffffffffffe10 >> 0x20));
      HighsMatrixSlice<HighsTripletListSlice>::iterator::operator++(&local_100);
    }
  }
  HighsLinearSumBounds::sumScaled
            (in_stack_fffffffffffffe20,(HighsInt)((ulong)in_stack_fffffffffffffe18 >> 0x20),
             in_stack_fffffffffffffe10);
  dVar10 = 1.0 / local_20;
  dVar12 = dVar10;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
  *pvVar5 = dVar12 * *pvVar5;
  dVar12 = dVar10;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
  *pvVar5 = dVar12 * *pvVar5;
  dVar12 = dVar10;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)local_14);
  *pvVar5 = dVar12 * *pvVar5;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)local_14);
  *pvVar5 = dVar10 * *pvVar5;
  if (local_20 < 0.0) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
    std::swap<double>(pvVar5,pvVar6);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x32),(long)local_14);
    pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x35),(long)local_14);
    std::swap<double>(pvVar5,pvVar6);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x38),(long)local_14);
    __b = std::vector<int,_std::allocator<int>_>::operator[]
                    ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3b),(long)local_14);
    std::swap<int>(pvVar7,__b);
  }
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)local_14);
  *(double *)(*in_RDI + 0xf8) = *pvVar5 * (double)local_28 + *(double *)(*in_RDI + 0xf8);
  dVar12 = local_20;
  pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)(*in_RDI + 8),(long)local_14);
  *pvVar5 = dVar12 * *pvVar5;
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xe),(long)local_14);
  local_134 = *pvVar7;
  while (HVar13 = (HighsInt)((ulong)in_stack_fffffffffffffe68 >> 0x20), local_134 != -1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_134);
    dVar10 = local_20;
    dVar12 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 5),(long)local_134);
    *pvVar5 = dVar10 * *pvVar5;
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 8),(long)local_134);
    iVar15 = *pvVar7;
    pHVar11 = (HPresolve *)(dVar12 * (double)local_28);
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)iVar15);
    if ((*pvVar5 != -INFINITY) || (NAN(*pvVar5))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x50),(long)iVar15);
      *pvVar5 = *pvVar5 - (double)pHVar11;
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)iVar15);
    if ((*pvVar5 != INFINITY) || (NAN(*pvVar5))) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x68),(long)iVar15);
      *pvVar5 = *pvVar5 - (double)pHVar11;
      in_stack_fffffffffffffdd0 = pHVar11;
    }
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_134);
    local_134 = *pvVar7;
  }
  pvVar8 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                     ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(*in_RDI + 0x178),
                      (long)local_14);
  if (*pvVar8 != kContinuous) {
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x20),(long)local_14);
    changeColLower(in_stack_fffffffffffffe70,HVar13,in_stack_fffffffffffffe60);
    std::vector<double,_std::allocator<double>_>::operator[]
              ((vector<double,_std::allocator<double>_> *)(*in_RDI + 0x38),(long)local_14);
    changeColUpper(in_stack_fffffffffffffe70,HVar13,in_stack_fffffffffffffe60);
    in_stack_fffffffffffffdcc = local_14;
  }
  markChangedCol(in_stack_fffffffffffffdd0,in_stack_fffffffffffffdcc);
  return;
}

Assistant:

void HPresolve::transformColumn(HighsPostsolveStack& postsolve_stack,
                                HighsInt col, double scale, double constant) {
  // replace column x by x = scale * x' + constant
  if (mipsolver != nullptr)
    mipsolver->mipdata_->implications.columnTransformed(col, scale, constant);

  postsolve_stack.linearTransform(col, scale, constant);

  // new variable x' has the following bounds:
  // scale > 0 --> (lb - constant) / scale <= x' <= (ub - constant) / scale
  // scale < 0 --> (ub - constant) / scale <= x' <= (lb - constant) / scale
  // each matrix coefficient a will be replaced by scale * a and, therefore, the
  // contributions to the constraint activities will change as follows:
  // a * lb --> (a * scale) * (lb - constant) / scale = a * (lb - constant)
  // a * ub --> (a * scale) * (ub - constant) / scale = a * (ub - constant).
  // therefore, for now the scaling can be neglected and the bounds on
  // constraint activities can be updated using the constant term.
  if (constant != 0.0) {
    double oldLower = model->col_lower_[col];
    double oldUpper = model->col_upper_[col];
    model->col_upper_[col] -= constant;
    model->col_lower_[col] -= constant;

    for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
      impliedRowBounds.updatedVarLower(nonzero.index(), col, nonzero.value(),
                                       oldLower);
      impliedRowBounds.updatedVarUpper(nonzero.index(), col, nonzero.value(),
                                       oldUpper);
    }

    double oldImplLower = implColLower[col];
    double oldImplUpper = implColUpper[col];
    implColLower[col] -= constant;
    implColUpper[col] -= constant;

    for (const HighsSliceNonzero& nonzero : getColumnVector(col)) {
      impliedRowBounds.updatedImplVarLower(nonzero.index(), col,
                                           nonzero.value(), oldImplLower,
                                           colLowerSource[col]);
      impliedRowBounds.updatedImplVarUpper(nonzero.index(), col,
                                           nonzero.value(), oldImplUpper,
                                           colUpperSource[col]);
    }
  }

  // now apply the scaling, which does not change the contributions to the
  // implied row bounds, but requires adjusting the implied bounds of the
  // columns dual constraint
  impliedDualRowBounds.sumScaled(col, scale);

  double boundScale = 1.0 / scale;
  model->col_lower_[col] *= boundScale;
  model->col_upper_[col] *= boundScale;
  implColLower[col] *= boundScale;
  implColUpper[col] *= boundScale;

  if (scale < 0) {
    std::swap(model->col_lower_[col], model->col_upper_[col]);
    std::swap(implColLower[col], implColUpper[col]);
    std::swap(colLowerSource[col], colUpperSource[col]);
  }

  model->offset_ += model->col_cost_[col] * constant;
  model->col_cost_[col] *= scale;

  for (HighsInt coliter = colhead[col]; coliter != -1;
       coliter = Anext[coliter]) {
    double val = Avalue[coliter];
    Avalue[coliter] *= scale;
    HighsInt row = Arow[coliter];
    double rowConstant = val * constant;
    if (model->row_lower_[row] != -kHighsInf)
      model->row_lower_[row] -= rowConstant;
    if (model->row_upper_[row] != kHighsInf)
      model->row_upper_[row] -= rowConstant;
  }

  // finally, use utility methods for rounding scaled bounds of
  // integer-constrained variables and updating bounds on constraint activities
  // accordingly. this should not be done before the preceding bound updates
  // (scaling and swaps) and matrix updates. we rely on the integrality status
  // being already updated to the newly scaled column by the caller, if
  // necessary.
  if (model->integrality_[col] != HighsVarType::kContinuous) {
    changeColLower(col, model->col_lower_[col]);
    changeColUpper(col, model->col_upper_[col]);
  }

  markChangedCol(col);
}